

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

int Gia_SplitCofVar2(Gia_Man_t *p,int *pnFanouts,int *pnCost)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int v;
  int v_00;
  
  if (p->pRefs == (int *)0x0) {
    Gia_ManCreateRefs(p);
  }
  v = -1;
  iVar2 = -1;
  for (v_00 = 0; v_00 < p->vCis->nSize - p->nRegs; v_00 = v_00 + 1) {
    pGVar3 = Gia_ManCi(p,v_00);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjRefNum(p,pGVar3);
    if (iVar2 < iVar1) {
      iVar2 = Gia_ObjRefNum(p,pGVar3);
      v = v_00;
    }
  }
  if (-1 < v) {
    pGVar3 = Gia_ManPi(p,v);
    iVar2 = Gia_ObjRefNum(p,pGVar3);
    *pnFanouts = iVar2;
    *pnCost = -1;
    return v;
  }
  __assert_fail("iBest >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSplit.c"
                ,0xdd,"int Gia_SplitCofVar2(Gia_Man_t *, int *, int *)");
}

Assistant:

int Gia_SplitCofVar2( Gia_Man_t * p, int * pnFanouts, int * pnCost )
{
    Gia_Obj_t * pObj;
    int i, iBest = -1, CostBest = -1;
    if ( p->pRefs == NULL )
        Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
        if ( CostBest < Gia_ObjRefNum(p, pObj) )
            iBest = i, CostBest = Gia_ObjRefNum(p, pObj);
    assert( iBest >= 0 );
    *pnFanouts = Gia_ObjRefNum(p, Gia_ManPi(p, iBest));
    *pnCost = -1;
    return iBest;
}